

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

void __thiscall
Js::DynamicType::DynamicType
          (DynamicType *this,ScriptContext *scriptContext,TypeId typeId,RecyclableObject *prototype,
          JavascriptMethod entryPoint,DynamicTypeHandler *typeHandler,bool isLocked,bool isShared)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicTypeHandler *pDVar4;
  bool isShared_local;
  bool isLocked_local;
  DynamicTypeHandler *typeHandler_local;
  JavascriptMethod entryPoint_local;
  RecyclableObject *prototype_local;
  TypeId typeId_local;
  ScriptContext *scriptContext_local;
  DynamicType *this_local;
  
  Js::Type::Type(&this->super_Type,scriptContext,typeId,prototype,entryPoint);
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierPtr(&this->typeHandler,typeHandler);
  this->isLocked = isLocked;
  this->isShared = isShared;
  this->hasNoEnumerableProperties = false;
  this->isCachedForChangePrototype = false;
  if (typeHandler == (DynamicTypeHandler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                ,0x1d,"(typeHandler != nullptr)","typeHandler != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((this->isLocked & 1U) != 0) {
    pDVar4 = Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::operator->(&this->typeHandler);
    bVar2 = DynamicTypeHandler::GetIsLocked(pDVar4);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x1e,"(!this->isLocked || this->typeHandler->GetIsLocked())",
                                  "!this->isLocked || this->typeHandler->GetIsLocked()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  if ((this->isShared & 1U) != 0) {
    pDVar4 = Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::operator->(&this->typeHandler);
    bVar2 = DynamicTypeHandler::GetIsShared(pDVar4);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x1f,"(!this->isShared || this->typeHandler->GetIsShared())",
                                  "!this->isShared || this->typeHandler->GetIsShared()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

DynamicType::DynamicType(ScriptContext* scriptContext, TypeId typeId, RecyclableObject* prototype, JavascriptMethod entryPoint, DynamicTypeHandler * typeHandler, bool isLocked, bool isShared)
        : Type(scriptContext, typeId, prototype, entryPoint) , typeHandler(typeHandler), isLocked(isLocked), isShared(isShared), hasNoEnumerableProperties(false)
#if DBG
        , isCachedForChangePrototype(false)
#endif
    {
        Assert(typeHandler != nullptr);
        Assert(!this->isLocked || this->typeHandler->GetIsLocked());
        Assert(!this->isShared || this->typeHandler->GetIsShared());
    }